

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.hpp
# Opt level: O2

void __thiscall cppurses::Event_loop::Event_loop(Event_loop *this)

{
  less<int> local_11;
  
  this->_vptr_Event_loop = (_func_int **)&PTR__Event_loop_0017c268;
  this->is_main_thread_ = false;
  (this->fut_).super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fut_).super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->fut_).super___basic_future<int>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 6) = 0;
  std::
  make_shared<sig::Signal_impl<void(),sig::Optional_last_value<void>,int,std::less<int>,std::function<void()>,std::mutex>,sig::Optional_last_value<void>const&,std::less<int>const&>
            ((Optional_last_value<void> *)&this->lifetime,&local_11);
  connect_to_system_exit(this);
  return;
}

Assistant:

Event_loop() { this->connect_to_system_exit(); }